

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlAttachObjectToListObject(JlDataObject *ListObject,JlDataObject *NewObject)

{
  JlListItem *pJVar1;
  JlListItem *listItem;
  JL_STATUS jlStatus;
  JlDataObject *NewObject_local;
  JlDataObject *ListObject_local;
  
  if ((ListObject == (JlDataObject *)0x0) || (NewObject == (JlDataObject *)0x0)) {
    listItem._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else if (ListObject->Type == JL_DATA_TYPE_LIST) {
    pJVar1 = (JlListItem *)WjTestLib_Calloc(0x18,1);
    if (pJVar1 == (JlListItem *)0x0) {
      listItem._4_4_ = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      pJVar1->Next = (JlListItem *)0x0;
      pJVar1->Object = NewObject;
      pJVar1->ParentList = (JlList *)&ListObject->field_2;
      if ((ListObject->field_2).List.ListTail == (JlListItem *)0x0) {
        (ListObject->field_2).List.ListHead = pJVar1;
      }
      else {
        ((ListObject->field_2).List.ListTail)->Next = pJVar1;
      }
      (ListObject->field_2).List.ListTail = pJVar1;
      (ListObject->field_2).Number.Type = (ListObject->field_2).Number.Type + 1;
      listItem._4_4_ = JL_STATUS_SUCCESS;
    }
  }
  else {
    listItem._4_4_ = JL_STATUS_WRONG_TYPE;
  }
  return listItem._4_4_;
}

Assistant:

JL_STATUS
    JlAttachObjectToListObject
    (
        JlDataObject*   ListObject,
        JlDataObject*   NewObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != ListObject
        &&  NULL != NewObject )
    {
        if( JL_DATA_TYPE_LIST == ListObject->Type )
        {
            // Create list item container for object
            JlListItem* listItem = JlNew( JlListItem );
            if( NULL != listItem )
            {
                listItem->Next = NULL;
                listItem->Object = NewObject;
                listItem->ParentList = &ListObject->List;

                JlLinkedListAddToEnd( ListObject->List.ListHead, ListObject->List.ListTail, listItem );
                ListObject->List.Count += 1;

                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}